

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

string * __thiscall
vkb::detail::SurfaceSupportErrorCategory::message_abi_cxx11_
          (string *__return_storage_ptr__,SurfaceSupportErrorCategory *this,int err)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_e;
  allocator<char> local_d;
  allocator<char> local_c;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  switch(err) {
  case 0:
    __s = "surface_handle_null";
    __a = &local_9;
    break;
  case 1:
    __s = "failed_get_surface_capabilities";
    __a = &local_a;
    break;
  case 2:
    __s = "failed_enumerate_surface_formats";
    __a = &local_b;
    break;
  case 3:
    __s = "failed_enumerate_present_modes";
    __a = &local_c;
    break;
  case 4:
    __s = "no_suitable_desired_format";
    __a = &local_d;
    break;
  default:
    __s = "";
    __a = &local_e;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string message(int err) const override {
        switch (static_cast<SurfaceSupportError>(err)) {
            CASE_TO_STRING(SurfaceSupportError, surface_handle_null)
            CASE_TO_STRING(SurfaceSupportError, failed_get_surface_capabilities)
            CASE_TO_STRING(SurfaceSupportError, failed_enumerate_surface_formats)
            CASE_TO_STRING(SurfaceSupportError, failed_enumerate_present_modes)
            CASE_TO_STRING(SurfaceSupportError, no_suitable_desired_format)
            default:
                return "";
        }
    }